

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__decode_uint8_srgb4_linearalpha(float *decodep,int width_times_channels,void *inputp)

{
  float *pfVar1;
  long lVar2;
  float *decode;
  
  lVar2 = 0;
  do {
    pfVar1 = decodep + lVar2;
    *pfVar1 = stbir__srgb_uchar_to_linear_float[*(byte *)((long)inputp + lVar2)];
    pfVar1[1] = stbir__srgb_uchar_to_linear_float[*(byte *)((long)inputp + lVar2 + 1)];
    pfVar1[2] = stbir__srgb_uchar_to_linear_float[*(byte *)((long)inputp + lVar2 + 2)];
    pfVar1[3] = (float)*(byte *)((long)inputp + lVar2 + 3) * 0.003921569;
    lVar2 = lVar2 + 4;
  } while (pfVar1 + 4 < decodep + width_times_channels);
  return;
}

Assistant:

static void STBIR__CODER_NAME(stbir__decode_uint8_srgb4_linearalpha)( float * decodep, int width_times_channels, void const * inputp )
{
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float const * decode_end = (float*) decode + width_times_channels;
  unsigned char const * input = (unsigned char const *)inputp;
  do {
    decode[0] = stbir__srgb_uchar_to_linear_float[ input[stbir__decode_order0] ];
    decode[1] = stbir__srgb_uchar_to_linear_float[ input[stbir__decode_order1] ];
    decode[2] = stbir__srgb_uchar_to_linear_float[ input[stbir__decode_order2] ];
    decode[3] = ( (float) input[stbir__decode_order3] ) * stbir__max_uint8_as_float_inverted;
    input += 4;
    decode += 4;
  } while( decode < decode_end );
}